

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_8da176::HandleReadCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  string *psVar5;
  long *plVar6;
  offset_in_Arguments_to_bool member;
  byte bVar7;
  _Ios_Seekdir _Var8;
  pointer pcVar9;
  long lVar10;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var11;
  string_view value;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  static_string_view name;
  static_string_view name_00;
  static_string_view name_01;
  string error;
  char c;
  string fileName;
  string output;
  Arguments arguments;
  ifstream file;
  undefined1 local_328 [32];
  cmExecutionStatus *local_308;
  bool local_300;
  undefined7 uStack_2ff;
  pointer local_2f8;
  long local_2f0 [2];
  string local_2e0;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_2c0;
  undefined1 local_2b0 [32];
  size_type local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  string local_260;
  char local_240;
  undefined1 local_238 [24];
  _Any_data local_220;
  _Manager_type p_Stack_210;
  _Invoker_type local_208;
  undefined1 auStack_200 [24];
  _Manager_type local_1e8;
  pointer ppStack_1e0;
  pointer local_1d8;
  pointer ppStack_1d0;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_308 = status;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x41) {
    local_238._0_8_ = (ActionMap *)(local_238 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_238,"READ must be called with at least two additional arguments","");
    std::__cxx11::string::_M_assign((string *)&local_308->Error);
    if ((ActionMap *)local_238._0_8_ != (ActionMap *)(local_238 + 0x10)) {
      operator_delete((void *)local_238._0_8_,
                      (ulong)((long)&(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)local_238._16_8_)->_M_impl).super__Vector_impl_data.
                                     _M_start + 1));
    }
    return false;
  }
  if (((anonymous_namespace)::
       HandleReadCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::parser == '\0') &&
     (iVar4 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   HandleReadCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::parser), iVar4 != 0)) {
    local_1d8 = (pointer)0x0;
    ppStack_1d0 = (pointer)0x0;
    local_1e8 = (_Manager_type)0x0;
    ppStack_1e0 = (pointer)0x0;
    auStack_200._8_8_ = 0;
    auStack_200._16_8_ = 0;
    local_208 = (_Invoker_type)0x0;
    auStack_200._0_8_ = (void *)0x0;
    local_220._8_8_ = 0;
    p_Stack_210 = (_Manager_type)0x0;
    local_238._16_8_ = (pointer)0x0;
    local_220._M_unused._M_object = (void *)0x0;
    local_238._0_8_ = (ActionMap *)0x0;
    local_238._8_8_ = (pointer)0x0;
    name.super_string_view._M_str = "OFFSET";
    name.super_string_view._M_len = 6;
    cmArgumentParser<(anonymous_namespace)::HandleReadCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<(anonymous_namespace)::HandleReadCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_238,name,0);
    member = 0x20;
    name_00.super_string_view._M_str = "LIMIT";
    name_00.super_string_view._M_len = 5;
    cmArgumentParser<(anonymous_namespace)::HandleReadCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<(anonymous_namespace)::HandleReadCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_238,name_00,0x20);
    name_01.super_string_view._M_str = "HEX";
    name_01.super_string_view._M_len = 3;
    cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)local_238,name_01,member)
    ;
    ArgumentParser::ActionMap::ActionMap
              ((ActionMap *)&HandleReadCommand::parser,(ActionMap *)local_238);
    ArgumentParser::Base::~Base((Base *)local_238);
    __cxa_atexit(ArgumentParser::Base::~Base,&HandleReadCommand::parser,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         HandleReadCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::parser);
  }
  local_2c0.End._M_current =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_2c0.Begin._M_current =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start + 3;
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  local_280._M_string_length = 0;
  local_280.field_2._M_local_buf[0] = '\0';
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  local_260._M_string_length = 0;
  local_260.field_2._M_local_buf[0] = '\0';
  local_240 = '\0';
  local_238._0_8_ = &HandleReadCommand::parser;
  local_238._8_8_ = (pointer)0x0;
  local_238._16_8_ = (pointer)0x0;
  local_220._M_unused._M_object = &local_280;
  local_220._8_8_ = 0;
  p_Stack_210 = (_Manager_type)0x0;
  local_208 = (_Invoker_type)0x0;
  auStack_200._0_8_ = (void *)0x0;
  auStack_200._8_8_ = 0;
  auStack_200._16_8_ = 0;
  local_1e8 = (_Manager_type)0x0;
  ppStack_1e0 = (pointer)0x0;
  local_1d8 = (pointer)((ulong)local_1d8 & 0xffffffffffffff00);
  ArgumentParser::Instance::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((Instance *)local_238,&local_2c0,0);
  if (local_1e8 != (_Manager_type)0x0) {
    (*local_1e8)((_Any_data *)(auStack_200 + 8),(_Any_data *)(auStack_200 + 8),__destroy_functor);
  }
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  pcVar9 = pbVar1[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2e0,pcVar9,pcVar9 + pbVar1[1]._M_string_length);
  bVar2 = cmsys::SystemTools::FileIsFullPath(&local_2e0);
  if (!bVar2) {
    psVar5 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(local_308->Makefile);
    local_238._8_8_ = (psVar5->_M_dataplus)._M_p;
    local_238._0_8_ = psVar5->_M_string_length;
    local_2c0.End._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0;
    local_2c0.Begin._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000001;
    local_2b0[0] = 0x2f;
    local_238._16_8_ = &DAT_00000001;
    p_Stack_210 = (_Manager_type)pbVar1[1]._M_dataplus._M_p;
    local_220._8_8_ = pbVar1[1]._M_string_length;
    views._M_len = 3;
    views._M_array = (iterator)local_238;
    local_220._M_unused._M_object = local_2c0.End._M_current;
    cmCatViews_abi_cxx11_((string *)local_328,views);
    std::__cxx11::string::operator=((string *)&local_2e0,(string *)local_328);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_328 + 0x10)) {
      operator_delete((void *)local_328._0_8_,CONCAT71(local_328._17_7_,local_328[0x10]) + 1);
    }
  }
  std::ifstream::ifstream(local_238,local_2e0._M_dataplus._M_p,_S_in);
  bVar2 = (local_220._M_pod_data
           [(long)&((((ActionMap *)(local_238._0_8_ + -0x70))->Positions).
                    super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                    .
                    super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->second] & 5U) == 0;
  if (bVar2) {
    if (local_260._M_string_length == 0) {
      _Var11._M_current = (pointer)0xffffffffffffffff;
    }
    else {
      bVar3 = cmStrToULongLong(&local_260,(unsigned_long_long *)&local_2c0);
      _Var11._M_current = (pointer)0xffffffffffffffff;
      if (bVar3) {
        _Var11._M_current = local_2c0.Begin._M_current;
      }
    }
    if ((local_280._M_string_length == 0) ||
       (bVar3 = cmStrToLongLong(&local_280,(longlong *)&local_2c0), !bVar3)) {
      _Var8 = _S_beg;
    }
    else {
      _Var8 = (_Ios_Seekdir)local_2c0.Begin._M_current;
    }
    std::istream::seekg((long)local_238,_Var8);
    local_2c0.Begin._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0;
    local_2c0.End._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_2b0._0_8_ = local_2b0._0_8_ & 0xffffffffffffff00;
    if (local_240 == '\x01') {
      if (_Var11._M_current != (pointer)0x0) {
        do {
          plVar6 = (long *)std::istream::get(local_238);
          if ((*(byte *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20) & 5) != 0) break;
          snprintf(local_328,4,"%.2x",(ulong)local_300);
          std::__cxx11::string::append((char *)&local_2c0);
          _Var11._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&_Var11._M_current[-1].field_2 + 0xf);
        } while (_Var11._M_current != (pointer)0x0);
      }
    }
    else {
      local_328._0_8_ = local_328 + 0x10;
      local_328._8_8_ = 0;
      local_328[0x10] = '\0';
      local_300 = false;
      if (_Var11._M_current != (pointer)0x0) {
        do {
          bVar3 = cmsys::SystemTools::GetLineFromStream
                            ((istream *)local_238,(string *)local_328,&local_300,
                             (size_type)_Var11._M_current);
          if (!bVar3) break;
          lVar10 = (long)_Var11._M_current - local_328._8_8_;
          bVar7 = lVar10 != 0 & local_300;
          std::__cxx11::string::_M_append((char *)&local_2c0,local_328._0_8_);
          if (local_300 == true) {
            std::__cxx11::string::append((char *)&local_2c0);
          }
          _Var11._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (lVar10 - (ulong)bVar7);
        } while (_Var11._M_current != (pointer)0x0);
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_328 + 0x10)) {
        operator_delete((void *)local_328._0_8_,CONCAT71(local_328._17_7_,local_328[0x10]) + 1);
      }
    }
    value._M_str = (char *)local_2c0.Begin._M_current;
    value._M_len = (size_t)local_2c0.End._M_current;
    cmMakefile::AddDefinition(local_308->Makefile,pbVar1 + 2,value);
    pcVar9 = (pointer)local_2b0._0_8_;
    _Var11._M_current = local_2c0.Begin._M_current;
    if (local_2c0.Begin._M_current ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0)
    goto LAB_002652e4;
  }
  else {
    cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
    local_2c0.Begin._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1c;
    local_2c0.End._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6b823b;
    local_2b0._0_8_ = local_2f8;
    local_2b0._16_8_ = 5;
    local_2b0._24_8_ = "):\n  ";
    local_290 = local_2e0._M_string_length;
    local_288 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2e0._M_dataplus._M_p;
    views_00._M_len = 4;
    views_00._M_array = (iterator)&local_2c0;
    cmCatViews_abi_cxx11_((string *)local_328,views_00);
    if ((long *)CONCAT71(uStack_2ff,local_300) != local_2f0) {
      operator_delete((long *)CONCAT71(uStack_2ff,local_300),local_2f0[0] + 1);
    }
    std::__cxx11::string::_M_assign((string *)&local_308->Error);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_328 + 0x10))
    goto LAB_002652e4;
    pcVar9 = (pointer)CONCAT71(local_328._17_7_,local_328[0x10]);
    _Var11._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_;
  }
  operator_delete(_Var11._M_current,(ulong)(pcVar9 + 1));
LAB_002652e4:
  std::ifstream::~ifstream(local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,
                    CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                             local_260.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,
                    CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                             local_280.field_2._M_local_buf[0]) + 1);
  }
  return bVar2;
}

Assistant:

bool HandleReadCommand(std::vector<std::string> const& args,
                       cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("READ must be called with at least two additional "
                    "arguments");
    return false;
  }

  std::string const& fileNameArg = args[1];
  std::string const& variable = args[2];

  struct Arguments
  {
    std::string Offset;
    std::string Limit;
    bool Hex = false;
  };

  static auto const parser = cmArgumentParser<Arguments>{}
                               .Bind("OFFSET"_s, &Arguments::Offset)
                               .Bind("LIMIT"_s, &Arguments::Limit)
                               .Bind("HEX"_s, &Arguments::Hex);

  Arguments const arguments = parser.Parse(cmMakeRange(args).advance(3),
                                           /*unparsedArguments=*/nullptr);

  std::string fileName = fileNameArg;
  if (!cmsys::SystemTools::FileIsFullPath(fileName)) {
    fileName = cmStrCat(status.GetMakefile().GetCurrentSourceDirectory(), '/',
                        fileNameArg);
  }

// Open the specified file.
#if defined(_WIN32) || defined(__CYGWIN__)
  cmsys::ifstream file(fileName.c_str(),
                       arguments.Hex ? (std::ios::binary | std::ios::in)
                                     : std::ios::in);
#else
  cmsys::ifstream file(fileName.c_str());
#endif

  if (!file) {
    std::string error =
      cmStrCat("failed to open for reading (",
               cmSystemTools::GetLastSystemError(), "):\n  ", fileName);
    status.SetError(error);
    return false;
  }

  // is there a limit?
  std::string::size_type sizeLimit = std::string::npos;
  if (!arguments.Limit.empty()) {
    unsigned long long limit;
    if (cmStrToULongLong(arguments.Limit, &limit)) {
      sizeLimit = static_cast<std::string::size_type>(limit);
    }
  }

  // is there an offset?
  cmsys::ifstream::off_type offset = 0;
  if (!arguments.Offset.empty()) {
    long long off;
    if (cmStrToLongLong(arguments.Offset, &off)) {
      offset = static_cast<cmsys::ifstream::off_type>(off);
    }
  }

  file.seekg(offset, std::ios::beg); // explicit ios::beg for IBM VisualAge 6

  std::string output;

  if (arguments.Hex) {
    // Convert part of the file into hex code
    char c;
    while ((sizeLimit > 0) && (file.get(c))) {
      char hex[4];
      snprintf(hex, sizeof(hex), "%.2x", c & 0xff);
      output += hex;
      sizeLimit--;
    }
  } else {
    std::string line;
    bool has_newline = false;
    while (
      sizeLimit > 0 &&
      cmSystemTools::GetLineFromStream(file, line, &has_newline, sizeLimit)) {
      sizeLimit = sizeLimit - line.size();
      if (has_newline && sizeLimit > 0) {
        sizeLimit--;
      }
      output += line;
      if (has_newline) {
        output += "\n";
      }
    }
  }
  status.GetMakefile().AddDefinition(variable, output);
  return true;
}